

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_d20889::TplModelTest_ExponentialEntropyBoundaryTest1_Test::TestBody
          (TplModelTest_ExponentialEntropyBoundaryTest1_Test *this)

{
  SEARCH_METHODS *message;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  AssertHelper in_stack_ffffffffffffffd8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  undefined8 *local_10;
  
  av1_exponential_entropy(1.0,0.0);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffe0._M_head_impl,(char *)in_stack_ffffffffffffffd8.data_,
             (char *)CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8),in_stack_00000018
             ,in_stack_00000010,in_stack_00000008);
  if (in_stack_ffffffffffffffe8 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (local_10 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/tpl_model_test.cc"
               ,0x2e,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if (in_stack_ffffffffffffffe0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffe0._M_head_impl + 8))();
    }
  }
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(local_10);
  }
  return;
}

Assistant:

TEST(TplModelTest, ExponentialEntropyBoundaryTest1) {
  double b = 0;
  double q_step = 1;
  double entropy = av1_exponential_entropy(q_step, b);
  EXPECT_NEAR(entropy, 0, 0.00001);
}